

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uint uVar1;
  ImFont *pIVar2;
  void *in_RCX;
  undefined4 in_EDX;
  ImFontAtlas *in_RSI;
  undefined8 in_RDI;
  ImFontConfig *in_R8;
  undefined4 in_XMM0_Da;
  ImFontConfig font_cfg;
  uchar *buf_decompressed_data;
  uint buf_decompressed_size;
  uchar *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  ImFontConfig *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffffd0;
  
  uVar1 = stb_decompress_length(&in_RSI->Locked);
  ImGui::MemAlloc((size_t)in_stack_ffffffffffffff40);
  stb_decompress((uchar *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff40,(uint)((ulong)in_RDI >> 0x20));
  if (in_RCX == (void *)0x0) {
    ImFontConfig::ImFontConfig(in_stack_ffffffffffffff50);
  }
  else {
    memcpy(&stack0xffffffffffffff40,in_RCX,0x88);
  }
  if (in_stack_ffffffffffffff40 == (uchar *)0x0) {
    pIVar2 = AddFontFromMemoryTTF
                       (in_RSI,(void *)CONCAT44(in_EDX,in_XMM0_Da),(int)((ulong)in_RCX >> 0x20),
                        SUB84(in_RCX,0),in_R8,(ImWchar *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
    return pIVar2;
  }
  __assert_fail("font_cfg.FontData == __null",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                ,0x715,
                "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
               );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}